

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

_Bool get_item_action(menu *menu,ui_event *event,wchar_t oid)

{
  object *obj;
  uchar ch;
  _Bool _Var1;
  ui_event_type uVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  
  pvVar4 = menu_priv((menu_conflict *)menu);
  uVar2 = event->type;
  uVar3 = (event->key).code;
  if (uVar2 == EVT_SELECT) {
    obj = *(object **)((long)pvVar4 + (long)oid * 0x100 + 0xa0);
    if (obj != (object *)0x0) {
      uVar5 = item_mode & 0x10;
      ch = cmd_lookup_key(item_cmd,(uint)(player->opts).opt[1]);
      _Var1 = get_item_allow(obj,ch,item_cmd,SUB41(uVar5 >> 4,0));
      if (_Var1) {
        selection = *(object **)((long)pvVar4 + (long)oid * 0x100 + 0xa0);
      }
    }
    uVar2 = event->type;
  }
  if (uVar2 != EVT_KBRD) {
    return false;
  }
  if ((char)uVar3 == '-') {
    if ((f2 < f1) && (allow_all == false)) {
LAB_001ea521:
      bell();
      return false;
    }
    player->upkeep->command_wrk = L'\x04';
  }
  else {
    uVar3 = uVar3 & 0xff;
    if (uVar3 == 0x7c) {
      if ((q2 < q1) && (allow_all == false)) goto LAB_001ea521;
      player->upkeep->command_wrk = L'\b';
    }
    else {
      if (uVar3 != 0x2f) {
        return false;
      }
      if ((((item_mode & 2U) == 0) && (allow_all != true)) ||
         (player->upkeep->command_wrk == L'\x02')) {
        if ((((item_mode & 1U) == 0) && (allow_all != true)) ||
           (player->upkeep->command_wrk == L'\x01')) goto LAB_001ea521;
        player->upkeep->command_wrk = L'\x01';
      }
      else {
        player->upkeep->command_wrk = L'\x02';
      }
    }
  }
  newmenu = 1;
  return false;
}

Assistant:

static bool get_item_action(struct menu *menu, const ui_event *event, int oid)
{
	struct object_menu_data *choice = menu_priv(menu);
	char key = event->key.code;
	bool is_harmless = item_mode & IS_HARMLESS ? true : false;
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	if (event->type == EVT_SELECT) {
		if (choice[oid].object && get_item_allow(choice[oid].object, cmd_lookup_key(item_cmd, mode),
						   item_cmd, is_harmless))
			selection = choice[oid].object;
	}

	if (event->type == EVT_KBRD) {
		if (key == '/') {
			/* Toggle if allowed */
			if (((item_mode & USE_INVEN) || allow_all)
				&& (player->upkeep->command_wrk != USE_INVEN)) {
				player->upkeep->command_wrk = USE_INVEN;
				newmenu = true;
			} else if (((item_mode & USE_EQUIP) || allow_all) &&
					   (player->upkeep->command_wrk != USE_EQUIP)) {
				player->upkeep->command_wrk = USE_EQUIP;
				newmenu = true;
			} else {
				bell();
			}
		}

		else if (key == '|') {
			/* No toggle allowed */
			if ((q1 > q2) && !allow_all){
				bell();
			} else {
				/* Toggle to quiver */
				player->upkeep->command_wrk = (USE_QUIVER);
				newmenu = true;
			}
		}

		else if (key == '-') {
			/* No toggle allowed */
			if ((f1 > f2) && !allow_all) {
				bell();
			} else {
				/* Toggle to floor */
				player->upkeep->command_wrk = (USE_FLOOR);
				newmenu = true;
			}
		}
	}

	return false;
}